

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall args::ArgumentParser::Help(ArgumentParser *this,ostream *help_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  ArgumentParser *pAVar4;
  bool bVar5;
  ulong uVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  ArgumentParser *pAVar10;
  ostream *poVar11;
  long lVar12;
  long *plVar13;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  pointer ptVar14;
  long *plVar15;
  size_type *psVar16;
  ulong uVar17;
  pointer pbVar18;
  string *__range1;
  HelpParams *pHVar19;
  const_iterator __begin3;
  undefined8 uVar20;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prognameline;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  proglines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandProgLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  epilog_text;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  description_text;
  undefined7 in_stack_fffffffffffffeb8;
  char in_stack_fffffffffffffebf;
  string local_140;
  byte local_11e;
  byte local_11d;
  undefined4 local_11c;
  HelpParams *local_118;
  undefined1 local_110 [24];
  long lStack_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  pointer local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 auVar21 [16];
  
  pAVar4 = this;
  do {
    pAVar10 = pAVar4;
    pAVar4 = (ArgumentParser *)(pAVar10->super_Command).selectedCommand;
  } while (pAVar4 != (ArgumentParser *)0x0);
  Wrap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&local_48,
       &(pAVar10->super_Command).help + ((pAVar10->super_Command).description._M_string_length != 0)
       ,(ulong)((this->helpParams).width - (this->helpParams).descriptionindent),0);
  Wrap(&local_60,&(pAVar10->super_Command).epilog,
       (ulong)((this->helpParams).width - (this->helpParams).descriptionindent),0);
  iVar8 = (*(pAVar10->super_Command).super_Group.super_Base._vptr_Base[10])(pAVar10);
  iVar9 = (*(pAVar10->super_Command).super_Group.super_Base._vptr_Base[0xb])(pAVar10);
  local_11d = (byte)iVar9;
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )0x0;
  local_a8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_b8,&(this->helpParams).usageString);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_b8,&(this->helpParams).programName);
  (*(pAVar10->super_Command).super_Group.super_Base._vptr_Base[0xd])
            (&local_78,pAVar10,&this->helpParams);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
             local_b8._8_8_,
             local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  uVar2 = (this->helpParams).width;
  uVar3 = (this->helpParams).progindent;
  end._M_current._0_4_ = uVar2 - ((this->helpParams).progtailindent + uVar3);
  end._M_current._4_4_ = 0;
  local_118 = &this->helpParams;
  Wrap<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_98,(args *)local_b8._M_allocated_capacity,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_b8._8_8_,end,(ulong)(uVar2 - uVar3),0,
             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  local_11e = (byte)iVar8;
  pbVar18 = local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_140,(char)(this->helpParams).progindent);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)help_,local_140._M_dataplus._M_p,local_140._M_string_length);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,((local_98.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                         (local_98.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    local_110[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_110,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    pbVar18 = local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  if (pbVar18 !=
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_140,(char)(this->helpParams).progtailindent);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)help_,local_140._M_dataplus._M_p,local_140._M_string_length);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(pbVar18->_M_dataplus)._M_p,pbVar18->_M_string_length);
      local_110[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_110,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      pbVar18 = pbVar18 + 1;
    } while (pbVar18 !=
             local_98.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_140._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)help_,(char *)&local_140,1);
  if (local_48._M_allocated_capacity != local_48._8_8_) {
    uVar20 = local_48._M_allocated_capacity;
    do {
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_140,(char)(this->helpParams).descriptionindent);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)help_,local_140._M_dataplus._M_p,local_140._M_string_length);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,*(char **)uVar20,*(undefined8 *)(uVar20 + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      uVar20 = uVar20 + 0x20;
    } while (uVar20 != local_48._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)help_,"\n",1);
  }
  if ((this->helpParams).optionsString._M_string_length != 0) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_140,(char)(this->helpParams).progindent);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)help_,local_140._M_dataplus._M_p,local_140._M_string_length);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(this->helpParams).optionsString._M_dataplus._M_p,
                         (this->helpParams).optionsString._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
  }
  (*(pAVar10->super_Command).super_Group.super_Base._vptr_Base[4])(local_110,pAVar10,local_118,0);
  local_80 = (pointer)local_110._8_8_;
  if (local_110._0_8_ == local_110._8_8_) {
    local_11c = 0;
  }
  else {
    paVar1 = &local_140.field_2;
    ptVar14 = (pointer)local_110._8_8_;
    pHVar19 = (HelpParams *)local_110._0_8_;
    do {
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&(pHVar19->shortPrefix)._M_string_length)->_M_allocated_capacity == 0) {
        local_11c = (undefined4)
                    CONCAT71((int7)((ulong)ptVar14 >> 8),
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&pHVar19->flagindent)->_M_allocated_capacity == 0);
      }
      else {
        local_11c = 0;
      }
      iVar8 = (this->helpParams).eachgroupindent * *(int *)&((_Alloc_hider *)&pHVar19->width)->_M_p;
      Wrap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d8,&pHVar19->shortPrefix,
           (ulong)((this->helpParams).width -
                  ((this->helpParams).flagindent + (this->helpParams).helpindent +
                  (this->helpParams).gutter)),0);
      local_118 = pHVar19;
      Wrap(&local_f0,(string *)&pHVar19->progtailindent,
           (ulong)((this->helpParams).width - ((this->helpParams).helpindent + iVar8)),0);
      cVar7 = (char)iVar8;
      pbVar18 = (pointer)local_d8._0_8_;
      if (local_d8._0_8_ == local_d8._8_8_) {
        lVar12 = 0;
      }
      else {
        do {
          if (pbVar18 != (pointer)local_d8._0_8_) {
            local_140._M_dataplus._M_p._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)help_,(char *)&local_140,1);
          }
          local_140._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_140,(char)(this->helpParams).flagindent + cVar7);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)help_,local_140._M_dataplus._M_p,
                               local_140._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,(pbVar18->_M_dataplus)._M_p,pbVar18->_M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != paVar1) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if (pbVar18->_M_string_length == 0) {
            lVar12 = 0;
          }
          else {
            auVar24 = vpbroadcastq_avx512f();
            auVar27 = ZEXT1664((undefined1  [16])0x0);
            uVar17 = 0;
            auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar28[8] = 0xc0;
            auVar28._0_8_ = 0xc0c0c0c0c0c0c0c0;
            auVar28[9] = 0xc0;
            auVar28[10] = 0xc0;
            auVar28[0xb] = 0xc0;
            auVar28[0xc] = 0xc0;
            auVar28[0xd] = 0xc0;
            auVar28[0xe] = 0xc0;
            auVar28[0xf] = 0xc0;
            auVar29[8] = 0x80;
            auVar29._0_8_ = 0x8080808080808080;
            auVar29[9] = 0x80;
            auVar29[10] = 0x80;
            auVar29[0xb] = 0x80;
            auVar29[0xc] = 0x80;
            auVar29[0xd] = 0x80;
            auVar29[0xe] = 0x80;
            auVar29[0xf] = 0x80;
            do {
              auVar26 = vmovdqa64_avx512f(auVar27);
              auVar27 = vpbroadcastq_avx512f();
              auVar27 = vporq_avx512f(auVar27,auVar25);
              uVar6 = vpcmpuq_avx512f(auVar27,auVar24,2);
              auVar21 = vmovdqu8_avx512vl(*(undefined1 (*) [16])
                                           ((pbVar18->_M_dataplus)._M_p + uVar17));
              auVar22[1] = ((byte)(uVar6 >> 1) & 1) * auVar21[1];
              auVar22[0] = ((byte)uVar6 & 1) * auVar21[0];
              auVar22[2] = ((byte)(uVar6 >> 2) & 1) * auVar21[2];
              auVar22[3] = ((byte)(uVar6 >> 3) & 1) * auVar21[3];
              auVar22[4] = ((byte)(uVar6 >> 4) & 1) * auVar21[4];
              auVar22[5] = ((byte)(uVar6 >> 5) & 1) * auVar21[5];
              auVar22[6] = ((byte)(uVar6 >> 6) & 1) * auVar21[6];
              auVar22[7] = (char)(uVar6 >> 7) * auVar21[7];
              auVar22._8_8_ = 0;
              auVar21 = vpand_avx(auVar22,auVar28);
              uVar20 = vpcmpb_avx512vl(auVar21,auVar29,4);
              auVar27 = vpmovm2q_avx512dq(uVar20);
              auVar27 = vpsubq_avx512f(auVar26,auVar27);
              uVar17 = uVar17 + 8;
            } while ((pbVar18->_M_string_length + 7 & 0xfffffffffffffff8) != uVar17);
            auVar24 = vmovdqa64_avx512f(auVar27);
            bVar5 = (bool)((byte)uVar6 & 1);
            auVar25._0_8_ = (ulong)bVar5 * auVar24._0_8_ | (ulong)!bVar5 * auVar26._0_8_;
            bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
            auVar25._8_8_ = (ulong)bVar5 * auVar24._8_8_ | (ulong)!bVar5 * auVar26._8_8_;
            bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
            auVar25._16_8_ = (ulong)bVar5 * auVar24._16_8_ | (ulong)!bVar5 * auVar26._16_8_;
            bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
            auVar25._24_8_ = (ulong)bVar5 * auVar24._24_8_ | (ulong)!bVar5 * auVar26._24_8_;
            bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
            auVar25._32_8_ = (ulong)bVar5 * auVar24._32_8_ | (ulong)!bVar5 * auVar26._32_8_;
            bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
            auVar25._40_8_ = (ulong)bVar5 * auVar24._40_8_ | (ulong)!bVar5 * auVar26._40_8_;
            bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
            auVar25._48_8_ = (ulong)bVar5 * auVar24._48_8_ | (ulong)!bVar5 * auVar26._48_8_;
            auVar25._56_8_ =
                 (uVar6 >> 7) * auVar24._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar26._56_8_;
            auVar23 = vextracti64x4_avx512f(auVar25,1);
            auVar24 = vpaddq_avx512f(auVar25,ZEXT3264(auVar23));
            auVar28 = vpaddq_avx(auVar24._0_16_,auVar24._16_16_);
            auVar29 = vpshufd_avx(auVar28,0xee);
            auVar28 = vpaddq_avx(auVar28,auVar29);
            lVar12 = auVar28._0_8_;
          }
          pbVar18 = pbVar18 + 1;
        } while (pbVar18 != (pointer)local_d8._8_8_);
      }
      pbVar18 = local_f0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = (this->helpParams).helpindent;
      lVar12 = (ulong)(this->helpParams).flagindent + lVar12;
      ptVar14 = (pointer)((ulong)(this->helpParams).gutter + lVar12);
      if (((ptVar14 <= (pointer)(ulong)uVar2) &&
          (local_f0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_f0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) &&
         ((this->helpParams).addNewlineBeforeDescription != true)) {
        local_140._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_140,(char)uVar2 - (char)lVar12);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)help_,local_140._M_dataplus._M_p,local_140._M_string_length)
        ;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(pbVar18->_M_dataplus)._M_p,pbVar18->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,&stack0xfffffffffffffebf,1);
        goto LAB_00159c59;
      }
      local_140._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)help_,(char *)&local_140,1);
      for (; pbVar18 !=
             local_f0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; pbVar18 = pbVar18 + 1) {
        local_140._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_140,(char)(this->helpParams).helpindent + cVar7);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)help_,local_140._M_dataplus._M_p,local_140._M_string_length)
        ;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(pbVar18->_M_dataplus)._M_p,pbVar18->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,&stack0xfffffffffffffebf,1);
LAB_00159c59:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8);
      pHVar19 = (HelpParams *)&local_118->longPrefix;
    } while (pHVar19 != (HelpParams *)local_80);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_110);
  cVar7 = (char)local_11c;
  if (((local_11e & local_11d) != 0) && ((this->helpParams).showTerminator == true)) {
    local_d8._0_8_ = (pointer)(local_d8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"\"","");
    plVar13 = (long *)std::__cxx11::string::_M_append
                                (local_d8,(ulong)(this->terminator)._M_dataplus._M_p);
    plVar15 = plVar13 + 2;
    if ((HelpParams *)*plVar13 == (HelpParams *)plVar15) {
      local_110._16_8_ = *plVar15;
      lStack_f8 = plVar13[3];
      local_110._0_8_ = (HelpParams *)(local_110 + 0x10);
    }
    else {
      local_110._16_8_ = *plVar15;
      local_110._0_8_ = (HelpParams *)*plVar13;
    }
    local_110._8_8_ = plVar13[1];
    *plVar13 = (long)plVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append(local_110);
    paVar1 = &local_140.field_2;
    psVar16 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_140.field_2._M_allocated_capacity = *psVar16;
      local_140.field_2._8_8_ = plVar13[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar16;
      local_140._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_140._M_string_length = plVar13[1];
    *plVar13 = (long)psVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    Wrap(&local_f0,&local_140,(ulong)((this->helpParams).width - (this->helpParams).flagindent),0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((HelpParams *)local_110._0_8_ != (HelpParams *)(local_110 + 0x10)) {
      operator_delete((void *)local_110._0_8_);
    }
    if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_);
    }
    if (local_f0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_f0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar18 = local_f0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_140._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_140,(char)(this->helpParams).flagindent);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)help_,local_140._M_dataplus._M_p,local_140._M_string_length)
        ;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(pbVar18->_M_dataplus)._M_p,pbVar18->_M_string_length);
        local_110[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_110,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        pbVar18 = pbVar18 + 1;
      } while (pbVar18 !=
               local_f0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f0);
    cVar7 = '\0';
  }
  if (cVar7 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)help_,"\n",1);
  }
  if (local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar18 = local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_140,(char)(this->helpParams).descriptionindent);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)help_,local_140._M_dataplus._M_p,local_140._M_string_length);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(pbVar18->_M_dataplus)._M_p,pbVar18->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      pbVar18 = pbVar18 + 1;
    } while (pbVar18 !=
             local_60.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  return;
}

Assistant:

void Help(std::ostream &help_) const
            {
                auto &command = SelectedCommand();
                const auto &commandDescription = command.Description().empty() ? command.Help() : command.Description();
                const auto description_text = Wrap(commandDescription, helpParams.width - helpParams.descriptionindent);
                const auto epilog_text = Wrap(command.Epilog(), helpParams.width - helpParams.descriptionindent);

                const bool hasoptions = command.HasFlag();
                const bool hasarguments = command.HasPositional();

                std::vector<std::string> prognameline;
                prognameline.push_back(helpParams.usageString);
                prognameline.push_back(Prog());
                auto commandProgLine = command.GetProgramLine(helpParams);
                prognameline.insert(prognameline.end(), commandProgLine.begin(), commandProgLine.end());

                const auto proglines = Wrap(prognameline.begin(), prognameline.end(),
                                            helpParams.width - (helpParams.progindent + helpParams.progtailindent),
                                            helpParams.width - helpParams.progindent);
                auto progit = std::begin(proglines);
                if (progit != std::end(proglines))
                {
                    help_ << std::string(helpParams.progindent, ' ') << *progit << '\n';
                    ++progit;
                }
                for (; progit != std::end(proglines); ++progit)
                {
                    help_ << std::string(helpParams.progtailindent, ' ') << *progit << '\n';
                }

                help_ << '\n';

                if (!description_text.empty())
                {
                    for (const auto &line: description_text)
                    {
                        help_ << std::string(helpParams.descriptionindent, ' ') << line << "\n";
                    }
                    help_ << "\n";
                }

                bool lastDescriptionIsNewline = false;

                if (!helpParams.optionsString.empty())
                {
                    help_ << std::string(helpParams.progindent, ' ') << helpParams.optionsString << "\n\n";
                }

                for (const auto &desc: command.GetDescription(helpParams, 0))
                {
                    lastDescriptionIsNewline = std::get<0>(desc).empty() && std::get<1>(desc).empty();
                    const auto groupindent = std::get<2>(desc) * helpParams.eachgroupindent;
                    const auto flags = Wrap(std::get<0>(desc), helpParams.width - (helpParams.flagindent + helpParams.helpindent + helpParams.gutter));
                    const auto info = Wrap(std::get<1>(desc), helpParams.width - (helpParams.helpindent + groupindent));

                    std::string::size_type flagssize = 0;
                    for (auto flagsit = std::begin(flags); flagsit != std::end(flags); ++flagsit)
                    {
                        if (flagsit != std::begin(flags))
                        {
                            help_ << '\n';
                        }
                        help_ << std::string(groupindent + helpParams.flagindent, ' ') << *flagsit;
                        flagssize = Glyphs(*flagsit);
                    }

                    auto infoit = std::begin(info);
                    // groupindent is on both sides of this inequality, and therefore can be removed
                    if ((helpParams.flagindent + flagssize + helpParams.gutter) > helpParams.helpindent || infoit == std::end(info) || helpParams.addNewlineBeforeDescription)
                    {
                        help_ << '\n';
                    } else
                    {
                        // groupindent is on both sides of the minus sign, and therefore doesn't actually need to be in here
                        help_ << std::string(helpParams.helpindent - (helpParams.flagindent + flagssize), ' ') << *infoit << '\n';
                        ++infoit;
                    }
                    for (; infoit != std::end(info); ++infoit)
                    {
                        help_ << std::string(groupindent + helpParams.helpindent, ' ') << *infoit << '\n';
                    }
                }
                if (hasoptions && hasarguments && helpParams.showTerminator)
                {
                    lastDescriptionIsNewline = false;
                    for (const auto &item: Wrap(std::string("\"") + terminator + "\" can be used to terminate flag options and force all following arguments to be treated as positional options", helpParams.width - helpParams.flagindent))
                    {
                        help_ << std::string(helpParams.flagindent, ' ') << item << '\n';
                    }
                }

                if (!lastDescriptionIsNewline)
                {
                    help_ << "\n";
                }

                for (const auto &line: epilog_text)
                {
                    help_ << std::string(helpParams.descriptionindent, ' ') << line << "\n";
                }
            }